

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O0

void dec_vproc_set_img_fmt(IepImg *img,MppFrame frm)

{
  RK_U32 RVar1;
  MppFrame frm_local;
  IepImg *img_local;
  
  memset(img,0,0x1c);
  RVar1 = mpp_frame_get_width(frm);
  img->act_w = (RK_U16)RVar1;
  RVar1 = mpp_frame_get_height(frm);
  img->act_h = (RK_U16)RVar1;
  RVar1 = mpp_frame_get_hor_stride(frm);
  img->vir_w = (RK_U16)RVar1;
  RVar1 = mpp_frame_get_ver_stride(frm);
  img->vir_h = (RK_U16)RVar1;
  img->format = 0x12;
  return;
}

Assistant:

static void dec_vproc_set_img_fmt(IepImg *img, MppFrame frm)
{
    memset(img, 0, sizeof(*img));
    img->act_w = mpp_frame_get_width(frm);
    img->act_h = mpp_frame_get_height(frm);
    img->vir_w = mpp_frame_get_hor_stride(frm);
    img->vir_h = mpp_frame_get_ver_stride(frm);
    img->format = IEP_FORMAT_YCbCr_420_SP;
}